

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::GetStandardDeviation
          (StatisticsAccumulation *this,Buffer *buffer,
          vector<double,_std::allocator<double>_> *standard_deviation)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  long in_RDX;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  Buffer *in_stack_00000070;
  StatisticsAccumulation *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  undefined1 local_1;
  
  if ((((*(byte *)(in_RDI + 0x12) & 1) == 0) || (*(int *)(in_RDI + 0xc) < 2)) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    bVar1 = GetDiagonalCovariance(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    if (bVar1) {
      iVar2 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffa8);
      iVar3 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffa8);
      iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffa8);
      std::
      transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::StatisticsAccumulation::GetStandardDeviation(sptk::StatisticsAccumulation::Buffer_const&,std::vector<double,std::allocator<double>>*)const::__0>
                (iVar2._M_current,iVar3._M_current,iVar4._M_current);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool StatisticsAccumulation::GetStandardDeviation(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* standard_deviation) const {
  if (!is_valid_ || num_statistics_order_ < 2 || NULL == standard_deviation) {
    return false;
  }

  if (!GetDiagonalCovariance(buffer, standard_deviation)) {
    return false;
  }

  std::transform(standard_deviation->begin(), standard_deviation->end(),
                 standard_deviation->begin(),
                 [](double x) { return std::sqrt(x); });

  return true;
}